

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

bool embree::avx::OrientedDiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  __int_type_conflict _Var13;
  RTCFilterFunctionN p_Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  RTCFilterFunctionNArguments local_188;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  RTCHitN local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar10 = context->scene;
  uVar23 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[Disc->sharedGeomID].ptr;
  lVar12 = *(long *)&pGVar11->field_0x58;
  _Var13 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar24 = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar23);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar28 = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar22);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar25 = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar20);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar33 = *(undefined1 (*) [16])(lVar12 + _Var13 * uVar21);
  auVar38 = vunpcklps_avx(auVar24,auVar25);
  auVar29 = vunpckhps_avx(auVar24,auVar25);
  auVar24 = vunpcklps_avx(auVar28,auVar33);
  auVar30 = vunpckhps_avx(auVar28,auVar33);
  auVar26 = vunpcklps_avx(auVar38,auVar24);
  local_198 = vunpckhps_avx(auVar38,auVar24);
  local_148 = vunpcklps_avx(auVar29,auVar30);
  lVar12 = *(long *)&pGVar11[1].time_range.upper;
  p_Var14 = pGVar11[1].intersectionFilterN;
  auVar24 = *(undefined1 (*) [16])(lVar12 + uVar23 * (long)p_Var14);
  auVar28 = *(undefined1 (*) [16])(lVar12 + uVar22 * (long)p_Var14);
  auVar25 = *(undefined1 (*) [16])(lVar12 + uVar20 * (long)p_Var14);
  auVar33 = *(undefined1 (*) [16])(lVar12 + (long)p_Var14 * uVar21);
  auVar38 = vunpcklps_avx(auVar24,auVar25);
  auVar24 = vunpckhps_avx(auVar24,auVar25);
  auVar25 = vunpcklps_avx(auVar28,auVar33);
  auVar28 = vunpckhps_avx(auVar28,auVar33);
  local_d8 = vunpcklps_avx(auVar24,auVar28);
  local_f8 = vunpcklps_avx(auVar38,auVar25);
  local_e8 = vunpckhps_avx(auVar38,auVar25);
  local_138 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x10);
  auVar33._4_4_ = fVar1;
  auVar33._0_4_ = fVar1;
  auVar33._8_4_ = fVar1;
  auVar33._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar36._4_4_ = fVar2;
  auVar36._0_4_ = fVar2;
  auVar36._8_4_ = fVar2;
  auVar36._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  fVar4 = *(float *)(ray + k * 4 + 0x50);
  fVar5 = *(float *)(ray + k * 4 + 0x60);
  auVar24._0_4_ = fVar3 * local_f8._0_4_ + fVar4 * local_e8._0_4_ + fVar5 * local_d8._0_4_;
  auVar24._4_4_ = fVar3 * local_f8._4_4_ + fVar4 * local_e8._4_4_ + fVar5 * local_d8._4_4_;
  auVar24._8_4_ = fVar3 * local_f8._8_4_ + fVar4 * local_e8._8_4_ + fVar5 * local_d8._8_4_;
  auVar24._12_4_ = fVar3 * local_f8._12_4_ + fVar4 * local_e8._12_4_ + fVar5 * local_d8._12_4_;
  auVar28 = vcmpps_avx(ZEXT416(0) << 0x20,auVar24,4);
  auVar38._8_4_ = 0x3f800000;
  auVar38._0_8_ = 0x3f8000003f800000;
  auVar38._12_4_ = 0x3f800000;
  auVar24 = vblendvps_avx(auVar38,auVar24,auVar28);
  auVar25 = vsubps_avx(local_148,auVar36);
  auVar33 = vsubps_avx(local_198,auVar33);
  fVar6 = *(float *)(ray + k * 4);
  auVar40._4_4_ = fVar6;
  auVar40._0_4_ = fVar6;
  auVar40._8_4_ = fVar6;
  auVar40._12_4_ = fVar6;
  auVar38 = vsubps_avx(auVar26,auVar40);
  auVar27._0_4_ =
       auVar33._0_4_ * local_e8._0_4_ + auVar25._0_4_ * local_d8._0_4_ +
       local_f8._0_4_ * auVar38._0_4_;
  auVar27._4_4_ =
       auVar33._4_4_ * local_e8._4_4_ + auVar25._4_4_ * local_d8._4_4_ +
       local_f8._4_4_ * auVar38._4_4_;
  auVar27._8_4_ =
       auVar33._8_4_ * local_e8._8_4_ + auVar25._8_4_ * local_d8._8_4_ +
       local_f8._8_4_ * auVar38._8_4_;
  auVar27._12_4_ =
       auVar33._12_4_ * local_e8._12_4_ + auVar25._12_4_ * local_d8._12_4_ +
       local_f8._12_4_ * auVar38._12_4_;
  local_108 = vdivps_avx(auVar27,auVar24);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar25._4_4_ = uVar7;
  auVar25._0_4_ = uVar7;
  auVar25._8_4_ = uVar7;
  auVar25._12_4_ = uVar7;
  auVar24 = vcmpps_avx(auVar25,local_108,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
  local_158._4_4_ = uVar7;
  local_158._0_4_ = uVar7;
  local_158._8_4_ = uVar7;
  local_158._12_4_ = uVar7;
  auVar25 = vcmpps_avx(local_108,local_158,2);
  auVar24 = vandps_avx(auVar25,auVar24);
  auVar25 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar25 = vpcmpgtd_avx(auVar25,_DAT_01f7fcf0);
  auVar24 = vandps_avx(auVar24,auVar25);
  auVar25 = auVar28 & auVar24;
  if ((((auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar25[0xf] < '\0') {
    auVar24 = vandps_avx(auVar28,auVar24);
    auVar38 = vunpckhps_avx(auVar29,auVar30);
    fVar15 = local_108._0_4_;
    fVar16 = local_108._4_4_;
    fVar17 = local_108._8_4_;
    fVar18 = local_108._12_4_;
    auVar30._0_4_ = fVar6 + fVar3 * fVar15;
    auVar30._4_4_ = fVar6 + fVar3 * fVar16;
    auVar30._8_4_ = fVar6 + fVar3 * fVar17;
    auVar30._12_4_ = fVar6 + fVar3 * fVar18;
    auVar31._0_4_ = fVar1 + fVar4 * fVar15;
    auVar31._4_4_ = fVar1 + fVar4 * fVar16;
    auVar31._8_4_ = fVar1 + fVar4 * fVar17;
    auVar31._12_4_ = fVar1 + fVar4 * fVar18;
    auVar34._0_4_ = fVar2 + fVar5 * fVar15;
    auVar34._4_4_ = fVar2 + fVar5 * fVar16;
    auVar34._8_4_ = fVar2 + fVar5 * fVar17;
    auVar34._12_4_ = fVar2 + fVar5 * fVar18;
    auVar28 = vsubps_avx(auVar30,auVar26);
    auVar25 = vsubps_avx(auVar31,local_198);
    auVar33 = vsubps_avx(auVar34,local_148);
    auVar29._0_4_ =
         auVar28._0_4_ * auVar28._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar33._0_4_ * auVar33._0_4_;
    auVar29._4_4_ =
         auVar28._4_4_ * auVar28._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar33._4_4_ * auVar33._4_4_;
    auVar29._8_4_ =
         auVar28._8_4_ * auVar28._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar33._8_4_ * auVar33._8_4_;
    auVar29._12_4_ =
         auVar28._12_4_ * auVar28._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar33._12_4_ * auVar33._12_4_;
    auVar28._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar28._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar28._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar28._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar28 = vcmpps_avx(auVar29,auVar28,1);
    auVar24 = vandps_avx(auVar28,auVar24);
    iVar19 = vmovmskps_avx(auVar24);
    if (iVar19 != 0) {
      auVar32 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_128 = ZEXT1232(ZEXT412(0)) << 0x20;
      uVar23 = (ulong)(byte)iVar19;
      auVar35 = ZEXT464(0) << 0x20;
      auVar24 = vpcmpeqd_avx(auVar36,auVar36);
      auVar37 = ZEXT1664(auVar24);
      auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      do {
        local_188.hit = local_c8;
        local_188.valid = (int *)local_1a8;
        uVar20 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
          }
        }
        uVar9 = *(uint *)(local_138 + uVar20 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar9].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_98 = *(undefined4 *)(local_128 + uVar20 * 4);
          uVar7 = *(undefined4 *)(local_128 + uVar20 * 4 + 0x10);
          local_88._4_4_ = uVar7;
          local_88._0_4_ = uVar7;
          local_88._8_4_ = uVar7;
          local_88._12_4_ = uVar7;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_108 + uVar20 * 4);
          local_188.context = context->user;
          local_68 = vpshufd_avx(ZEXT416(uVar9),0);
          uVar9 = (Disc->primIDs).field_0.i[uVar20];
          local_78._4_4_ = uVar9;
          local_78._0_4_ = uVar9;
          local_78._8_4_ = uVar9;
          local_78._12_4_ = uVar9;
          uVar7 = *(undefined4 *)(local_f8 + uVar20 * 4);
          uVar8 = *(undefined4 *)(local_e8 + uVar20 * 4);
          local_b8._4_4_ = uVar8;
          local_b8._0_4_ = uVar8;
          local_b8._8_4_ = uVar8;
          local_b8._12_4_ = uVar8;
          uVar8 = *(undefined4 *)(local_d8 + uVar20 * 4);
          local_a8._4_4_ = uVar8;
          local_a8._0_4_ = uVar8;
          local_a8._8_4_ = uVar8;
          local_a8._12_4_ = uVar8;
          local_c8[0] = (RTCHitN)(char)uVar7;
          local_c8[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[4] = (RTCHitN)(char)uVar7;
          local_c8[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[8] = (RTCHitN)(char)uVar7;
          local_c8[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_c8[0xc] = (RTCHitN)(char)uVar7;
          local_c8[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_c8[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_c8[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          vcmpps_avx(auVar32._0_32_,auVar32._0_32_,0xf);
          uStack_54 = (local_188.context)->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = (local_188.context)->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_1a8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_188.geometryUserPtr = pGVar11->userPtr;
          local_188.N = 4;
          local_188.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_198._0_8_ = Disc;
            auVar24 = auVar37._0_16_;
            (*pGVar11->occlusionFilterN)(&local_188);
            auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar24 = vpcmpeqd_avx(auVar24,auVar24);
            auVar37 = ZEXT1664(auVar24);
            auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
            Disc = (Primitive *)local_198._0_8_;
          }
          auVar24 = auVar37._0_16_;
          if (local_1a8 == (undefined1  [16])0x0) {
            auVar28 = vpcmpeqd_avx(auVar35._0_16_,(undefined1  [16])0x0);
            auVar24 = auVar24 ^ auVar28;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_188);
              auVar39 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar24 = vpcmpeqd_avx(auVar24,auVar24);
              auVar37 = ZEXT1664(auVar24);
              auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar28 = vpcmpeqd_avx(auVar35._0_16_,local_1a8);
            auVar24 = auVar37._0_16_ ^ auVar28;
            auVar28 = vblendvps_avx(auVar39._0_16_,*(undefined1 (*) [16])(local_188.ray + 0x80),
                                    auVar28);
            *(undefined1 (*) [16])(local_188.ray + 0x80) = auVar28;
          }
          auVar26._8_8_ = 0x100000001;
          auVar26._0_8_ = 0x100000001;
          if ((auVar26 & auVar24) != (undefined1  [16])0x0) {
            return true;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_158._0_4_;
        }
        uVar23 = uVar23 ^ 1L << (uVar20 & 0x3f);
      } while (uVar23 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }